

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
::operator*(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
            *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  char *__function;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
  *this_00;
  
  this_00 = (btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
             *)this->node_;
  if (this_00 ==
      (btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
       *)0x0) {
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
                 *)0x0);
LAB_001df1c8:
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
                 *)this_00);
LAB_001df1cd:
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
                 *)this_00);
LAB_001df1d2:
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>,google::protobuf::FileDescriptor_const*const&,google::protobuf::FileDescriptor_const*const*>
                 *)this_00);
  }
  else {
    iVar1 = this->position_;
    bVar2 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            ::start((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                     *)this_00);
    if (iVar1 < (int)(uint)bVar2) goto LAB_001df1c8;
    if (((ulong)this->node_ & 7) == 0) {
      if (this->position_ < (int)(uint)(byte)this->node_[10]) {
LAB_001df1a9:
        if (((ulong)this->node_ & 7) == 0) {
          return (reference)(this->node_ + (ulong)(byte)this->position_ * 8 + 0x10);
        }
        __function = 
        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = char]"
        ;
        goto LAB_001df203;
      }
      this_00 = this;
      bVar3 = IsEndIterator(this);
      if (bVar3) goto LAB_001df1cd;
      if (((ulong)this->node_ & 7) != 0) goto LAB_001df1d7;
      if (this->position_ < (int)(uint)(byte)this->node_[10]) goto LAB_001df1a9;
      goto LAB_001df1d2;
    }
  }
LAB_001df1d7:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
  ;
LAB_001df203:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    assert_valid_generation(node_);
    ABSL_HARDENING_ASSERT(position_ >= node_->start());
    if (position_ >= node_->finish()) {
      ABSL_HARDENING_ASSERT(!IsEndIterator() && "Dereferencing end() iterator");
      ABSL_HARDENING_ASSERT(position_ < node_->finish());
    }
    return node_->value(static_cast<field_type>(position_));
  }